

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixFixSize.h
# Opt level: O2

string * __thiscall
iDynTree::MatrixFixSize<6u,6u>::toString_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  size_t col;
  long lVar2;
  size_t row;
  long lVar3;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
      poVar1 = std::ostream::_M_insert<double>(*(double *)((long)this + lVar2 * 8));
      std::operator<<(poVar1," ");
    }
    std::endl<char,std::char_traits<char>>(local_1a8);
    this = (void *)((long)this + 0x30);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string MatrixFixSize<nRows,nCols>::toString() const
    {
        std::stringstream ss;

        for(std::size_t row=0; row < this->rows(); row++ )
        {
            for(std::size_t col=0; col < this->cols(); col++ )
            {
                ss << this->m_data[this->rawIndexRowMajor(row,col)] << " ";
            }
            ss << std::endl;
        }

        return ss.str();
    }